

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O0

void helper_gvec_pmull_q_arm(void *vd,void *vn,void *vm,uint32_t desc)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  int32_t iVar4;
  uintptr_t opr_sz_00;
  uintptr_t max_sz;
  byte bVar5;
  uint64_t mask;
  uint64_t rlo;
  uint64_t rhi;
  uint64_t mm;
  uint64_t nn;
  uint64_t *m;
  uint64_t *n;
  uint64_t *d;
  intptr_t hi;
  intptr_t opr_sz;
  intptr_t j;
  intptr_t i;
  uint32_t desc_local;
  void *vm_local;
  void *vn_local;
  void *vd_local;
  
  opr_sz_00 = simd_oprsz(desc);
  iVar4 = simd_data(desc);
  for (j = 0; j < (long)opr_sz_00 / 8; j = j + 2) {
    uVar1 = *(ulong *)((long)vn + (j + iVar4) * 8);
    uVar2 = *(ulong *)((long)vm + (j + iVar4) * 8);
    rlo = 0;
    mask = 0;
    if ((uVar1 & 1) != 0) {
      mask = uVar2;
    }
    for (opr_sz = 1; opr_sz < 0x40; opr_sz = opr_sz + 1) {
      bVar5 = (byte)opr_sz;
      uVar3 = -(uVar1 >> (bVar5 & 0x3f) & 1);
      mask = uVar2 << (bVar5 & 0x3f) & uVar3 ^ mask;
      rlo = uVar2 >> (0x40 - bVar5 & 0x3f) & uVar3 ^ rlo;
    }
    *(uint64_t *)((long)vd + j * 8) = mask;
    *(uint64_t *)((long)vd + j * 8 + 8) = rlo;
  }
  max_sz = simd_maxsz(desc);
  clear_tail(vd,opr_sz_00,max_sz);
  return;
}

Assistant:

void HELPER(gvec_pmull_q)(void *vd, void *vn, void *vm, uint32_t desc)
{
    intptr_t i, j, opr_sz = simd_oprsz(desc);
    intptr_t hi = simd_data(desc);
    uint64_t *d = vd, *n = vn, *m = vm;

    for (i = 0; i < opr_sz / 8; i += 2) {
        uint64_t nn = n[i + hi];
        uint64_t mm = m[i + hi];
        uint64_t rhi = 0;
        uint64_t rlo = 0;

        /* Bit 0 can only influence the low 64-bit result.  */
        if (nn & 1) {
            rlo = mm;
        }

        for (j = 1; j < 64; ++j) {
#ifdef _MSC_VER
            uint64_t mask = 0 - ((nn >> j) & 1);
#else
            uint64_t mask = -((nn >> j) & 1);
#endif
            rlo ^= (mm << j) & mask;
            rhi ^= (mm >> (64 - j)) & mask;
        }
        d[i] = rlo;
        d[i + 1] = rhi;
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}